

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YeeGridTests.cpp
# Opt level: O0

void __thiscall YeeGridTest3d::SetUp(YeeGridTest3d *this)

{
  IndexType *in_RDI;
  PositionType *step;
  PositionType *origin;
  IndexType *this_00;
  Vector3<int> local_44;
  Vector3<double> local_38;
  Vector3<double> local_20;
  
  pica::Vector3<double>::Vector3(&local_20,-1.5,3.4,0.31);
  origin = (PositionType *)(in_RDI + 2);
  *(double *)&in_RDI[3].y = local_20.z;
  *(double *)(in_RDI + 2) = local_20.x;
  *(double *)&in_RDI[2].z = local_20.y;
  pica::Vector3<double>::Vector3(&local_38,0.1,0.2,0.15);
  this_00 = in_RDI + 4;
  *(double *)&in_RDI[5].y = local_38.z;
  *(double *)(in_RDI + 4) = local_38.x;
  *(double *)&in_RDI[4].z = local_38.y;
  pica::Vector3<int>::Vector3(&local_44,0xc,3,4);
  in_RDI[6].z = local_44.z;
  in_RDI[6].x = local_44.x;
  in_RDI[6].y = local_44.y;
  step = (PositionType *)&in_RDI[1].y;
  operator_new(0x198);
  pica::YeeGrid<(pica::Dimension)3,_double>::YeeGrid
            ((YeeGrid<(pica::Dimension)3,_double> *)this_00,origin,step,in_RDI);
  std::auto_ptr<pica::YeeGrid<(pica::Dimension)3,_double>_>::reset
            ((auto_ptr<pica::YeeGrid<(pica::Dimension)3,_double>_> *)this_00,(element_type *)origin)
  ;
  return;
}

Assistant:

virtual void SetUp()
    {
        origin = PositionType(-1.5, 3.4, 0.31);
        step = PositionType(0.1, 0.2, 0.15);
        size = IndexType(12, 3, 4);
        grid.reset(new GridType(origin, step, size));
    }